

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderManager.hpp
# Opt level: O3

void __thiscall
sjtu::OrderManager::refund_ticket
          (OrderManager *this,UserManager *user_manager,TrainManager *train_manager,int argc,
          string *argv)

{
  char *__s;
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *pBVar1;
  FileManager<std::pair<sjtu::orderType,_long>_> *pFVar2;
  OrderManager *pOVar3;
  UserManager *this_00;
  bool bVar4;
  int iVar5;
  long *plVar6;
  orderType *order;
  size_t sVar7;
  orderType *order_00;
  pair<const_std::pair<unsigned_long_long,_int>,_long> *ppVar8;
  undefined8 uVar9;
  string *psVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> pendinglist;
  string uname;
  char *local_f8;
  uint local_f0;
  TrainManager *local_e8;
  OrderManager *local_e0;
  pair<unsigned_long_long,_int> local_d8;
  char *local_c8;
  long local_c0;
  char local_b8;
  undefined7 uStack_b7;
  long *local_a8;
  long local_a0;
  long local_98 [2];
  UserManager *local_88;
  long *local_80;
  long local_78;
  long local_70 [2];
  string local_60;
  ulong local_40;
  undefined4 local_38;
  undefined4 extraout_var;
  
  local_c8 = &local_b8;
  local_c0 = 0;
  local_b8 = '\0';
  iVar14 = 0;
  local_e8 = train_manager;
  local_e0 = this;
  local_88 = user_manager;
  if (argc < 1) {
    iVar5 = 1;
  }
  else {
    psVar10 = argv + 1;
    lVar13 = 1;
    do {
      iVar5 = std::__cxx11::string::compare((char *)(psVar10 + -1));
      if (iVar5 == 0) {
        std::__cxx11::string::_M_assign((string *)&local_c8);
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)(psVar10 + -1));
        if (iVar5 == 0) {
          ppVar8 = (pair<const_std::pair<unsigned_long_long,_int>,_long> *)
                   (psVar10->_M_dataplus)._M_p;
          plVar6 = (long *)__errno_location();
          lVar11 = *plVar6;
          *(int *)plVar6 = 0;
          lVar13 = strtol((char *)ppVar8,&local_f8,10);
          if ((pair<const_std::pair<unsigned_long_long,_int>,_long> *)local_f8 == ppVar8) {
LAB_0010a560:
            uVar9 = std::__throw_invalid_argument("stoi");
            if (local_80 != plVar6) {
              operator_delete(local_80,local_70[0] + 1);
            }
            if (local_a8 != local_98) {
              operator_delete(local_a8,local_98[0] + 1);
            }
            if (local_c8 != &local_b8) {
              operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
            }
            _Unwind_Resume(uVar9);
          }
          if (((int)lVar13 != lVar13) || ((int)*plVar6 == 0x22)) {
            std::__throw_out_of_range("stoi");
            goto LAB_0010a560;
          }
          if ((int)*plVar6 == 0) {
            *(int *)plVar6 = (int)lVar11;
          }
        }
      }
      iVar5 = (int)lVar13;
      psVar10 = psVar10 + 2;
      iVar14 = iVar14 + 2;
    } while (iVar14 < argc);
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_60,local_c8,local_c8 + local_c0);
  this_00 = local_88;
  pOVar3 = local_e0;
  bVar4 = UserManager::is_login(local_88,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    order = (orderType *)operator_new(0xb8);
    order->date[1].month = 0;
    order->date[1].day = 0;
    order->date[1].hour = 0;
    order->date[1].minute = 0;
    order->date[0].month = 0;
    order->date[0].day = 0;
    order->date[0].hour = 0;
    order->date[0].minute = 0;
    strcpy((char *)order,local_c8);
    bVar4 = UserManager::refund_order(this_00,pOVar3,iVar5,order);
    if (bVar4) {
      if (order->status == success) {
        TrainManager::refund_ticket(local_e8,order);
        pBVar1 = pOVar3->PendingBpTree;
        __s = order->trainID;
        local_a8 = local_98;
        sVar7 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,__s,order->trainID + sVar7);
        if (local_a0 == 0) {
          local_d8.first = 0;
        }
        else {
          lVar11 = 0;
          lVar13 = 0;
          local_d8.first = 0;
          do {
            lVar13 = ((long)*(char *)((long)local_a8 + lVar11) + lVar13 * 0x239 + 0x100) %
                     0x3b800001;
            local_d8.first =
                 (long)((long)*(char *)((long)local_a8 + lVar11) + local_d8.first * 0x301 + 0x100) %
                 0x3b9aca07;
            lVar11 = lVar11 + 1;
          } while (local_a0 != lVar11);
          local_d8.first = lVar13 << 0x20 | local_d8.first;
        }
        local_d8.second = 0;
        local_80 = local_70;
        sVar7 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,__s,__s + sVar7);
        if (local_78 == 0) {
          local_40 = 0;
        }
        else {
          lVar11 = 0;
          lVar13 = 0;
          local_40 = 0;
          do {
            lVar13 = ((long)*(char *)((long)local_80 + lVar11) + lVar13 * 0x239 + 0x100) %
                     0x3b800001;
            local_40 = (long)((long)*(char *)((long)local_80 + lVar11) + local_40 * 0x301 + 0x100) %
                       0x3b9aca07;
            lVar11 = lVar11 + 1;
          } while (local_78 != lVar11);
          local_40 = lVar13 << 0x20 | local_40;
        }
        local_38 = 0x7fffffff;
        BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
        ::range_query((BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
                       *)&local_f8,(pair<unsigned_long_long,_int> *)pBVar1,&local_d8);
        pOVar3 = local_e0;
        if (local_80 != local_70) {
          operator_delete(local_80,local_70[0] + 1);
        }
        if (local_a8 != local_98) {
          operator_delete(local_a8,local_98[0] + 1);
        }
        if (local_f0 != 0) {
          uVar12 = 0;
          do {
            pFVar2 = pOVar3->OrderFile;
            local_d8.first = uVar12;
            vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_>::operator[]
                      ((vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> *)
                       &local_f8,&local_d8.first);
            iVar14 = (*(pFVar2->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).
                       _vptr_FileManager_Base[2])(pFVar2);
            order_00 = (orderType *)CONCAT44(extraout_var,iVar14);
            if (((order_00->status != refunded) &&
                (bVar4 = TrainManager::buy_ticket(local_e8,order_00), bVar4)) &&
               (order_00->status != pending)) {
              (*(pOVar3->OrderFile->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).
                _vptr_FileManager_Base[3])(pOVar3->OrderFile,&order_00->offset);
              pBVar1 = pOVar3->PendingBpTree;
              local_d8.first = uVar12;
              ppVar8 = vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_>::
                       operator[]((vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_>
                                   *)&local_f8,&local_d8.first);
              BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
              ::erase(pBVar1,&ppVar8->first);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 < local_f0);
        }
        operator_delete(local_f8);
      }
      plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,0);
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    }
    else {
      plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    }
    std::ostream::put((char)plVar6);
    std::ostream::flush();
    operator_delete(order,0xb8);
  }
  else {
    plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    std::ostream::put((char)plVar6);
    std::ostream::flush();
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
  }
  return;
}

Assistant:

void refund_ticket(UserManager *user_manager, TrainManager *train_manager, int argc, std::string *argv) {
            std::string uname;
            int number = 1;
            for (int i = 0; i < argc; i += 2) {
                if (argv[i] == "-u") uname = argv[i + 1];
                else if (argv[i] == "-n") number = stoi(argv[i + 1]);
            }
            if (user_manager->is_login(uname) == false) std::cout << -1 << std::endl;
            else {
                orderType *tmp = new orderType;
                strcpy(tmp->username, uname.c_str());
                if (user_manager->refund_order(this, number, tmp)) {
                    if (tmp -> status == success)
                    {
                        train_manager -> refund_ticket(tmp);
                        auto pendinglist = PendingBpTree -> range_query(
                                std::make_pair(hasher(tmp -> trainID) , 0) ,
                                std::make_pair(hasher(tmp -> trainID) , 0x7fffffff));
                        for (int i = 0 ; i < pendinglist . size() ; ++ i)
                        {
                            auto ret = OrderFile -> read(pendinglist[i] . second);
                            if (ret -> first . status != refunded && train_manager -> buy_ticket(&(ret -> first)))
                                if (ret -> first . status != pending)
                                {
                                    OrderFile -> save(ret -> first . offset);
                                    PendingBpTree -> erase(pendinglist[i] . first);
                                }
                        }
                    }
                    std::cout << 0 << std::endl;
                } else std::cout << -1 << std::endl;
                delete tmp;
            }
        }